

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.h
# Opt level: O0

void __thiscall uWS::TemplatedApp<true>::~TemplatedApp(TemplatedApp<true> *this)

{
  bool bVar1;
  reference ppWVar2;
  void *in_RSI;
  undefined1 *__ptr;
  __normal_iterator<uWS::WebSocketContext<true,_true>_**,_std::vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>_>
  *in_RDI;
  WebSocketContext<true,_true> *webSocketContext;
  iterator __end0;
  iterator __begin0;
  vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>
  *__range3;
  vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>
  *in_stack_ffffffffffffffc8;
  iterator in_stack_ffffffffffffffe0;
  __normal_iterator<uWS::WebSocketContext<true,_true>_**,_std::vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>_>
  local_18;
  __normal_iterator<uWS::WebSocketContext<true,_true>_**,_std::vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>_>
  *local_10;
  
  if (in_RDI->_M_current != (WebSocketContext<true,_true> **)0x0) {
    HttpContext<true>::free((HttpContext<true> *)in_RDI->_M_current,in_RSI);
    local_10 = in_RDI + 1;
    local_18._M_current =
         (WebSocketContext<true,_true> **)
         std::
         vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>
         ::begin(in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffe0 =
         std::
         vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>
         ::end(in_stack_ffffffffffffffc8);
    while( true ) {
      __ptr = &stack0xffffffffffffffe0;
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<uWS::WebSocketContext<true,_true>_**,_std::vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>_>
                                 *)in_stack_ffffffffffffffc8);
      if (!bVar1) break;
      ppWVar2 = __gnu_cxx::
                __normal_iterator<uWS::WebSocketContext<true,_true>_**,_std::vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>_>
                ::operator*(&local_18);
      WebSocketContext<true,_true>::free(*ppWVar2,__ptr);
      __gnu_cxx::
      __normal_iterator<uWS::WebSocketContext<true,_true>_**,_std::vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>_>
      ::operator++(&local_18);
    }
  }
  std::
  vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>
  ::~vector((vector<uWS::WebSocketContext<true,_true>_*,_std::allocator<uWS::WebSocketContext<true,_true>_*>_>
             *)in_stack_ffffffffffffffe0._M_current);
  return;
}

Assistant:

~TemplatedApp() {
        /* Let's just put everything here */
        if (httpContext) {
            httpContext->free();

            for (auto *webSocketContext : webSocketContexts) {
                webSocketContext->free();
            }
        }
    }